

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint * RDL_giveURF(RDL_data *data,uint index,char mode)

{
  uint bcc_index;
  uint urf_internal_index;
  uint uVar1;
  RDL_graph *pRVar2;
  char *edges;
  void *__ptr;
  uint *puVar3;
  RDL_node *pRVar4;
  int iVar5;
  undefined7 in_register_00000011;
  uint rcf_internal_index;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar5 = (int)CONCAT71(in_register_00000011,mode);
  if (iVar5 == 0x62) {
    bcc_index = data->urf_to_bcc[index][0];
    urf_internal_index = data->urf_to_bcc[index][1];
    pRVar2 = data->bccGraphs->bcc_graphs[bcc_index];
    edges = (char *)calloc(1,(ulong)pRVar2->E);
    uVar1 = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[urf_internal_index];
    __ptr = malloc(0x100);
    for (rcf_internal_index = 0; uVar1 != rcf_internal_index;
        rcf_internal_index = rcf_internal_index + 1) {
      RDL_getEdges_internal(data,bcc_index,urf_internal_index,rcf_internal_index,edges);
    }
    uVar7 = 0x40;
    uVar8 = 0;
    for (uVar6 = 0; iVar5 = (int)uVar8, uVar6 < pRVar2->E; uVar6 = uVar6 + 1) {
      uVar9 = uVar8;
      if (edges[uVar6] == '\x01') {
        if (iVar5 == (int)uVar7) {
          uVar7 = (ulong)(uint)((int)uVar7 * 2);
          __ptr = realloc(__ptr,uVar7 * 4);
        }
        uVar9 = (ulong)(iVar5 + 1);
        *(uint *)((long)__ptr + uVar8 * 4) =
             data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar6];
      }
      uVar8 = uVar9;
    }
    puVar3 = (uint *)realloc(__ptr,(ulong)(iVar5 + 1) << 2);
    puVar3[uVar8] = 0xffffffff;
    free(edges);
    return puVar3;
  }
  if (iVar5 == 0x61) {
    pRVar4 = RDL_getNodesURF(data,index);
    return pRVar4;
  }
  (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveURF()\' with invalid mode \'%c\'\n",
                    (ulong)(uint)(int)mode);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                ,0x2b2,"unsigned int *RDL_giveURF(const RDL_data *, unsigned int, char)");
}

Assistant:

static unsigned *RDL_giveURF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesURF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesURF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveURF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}